

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O3

HitTmp __thiscall BasicContainer::treehit(BasicContainer *this,Ray *ray,treenode *node)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  BasicPrimitive *pBVar3;
  BasicPrimitive *pBVar4;
  float in_XMM1_Da;
  undefined4 in_XMM1_Db;
  HitTmp HVar5;
  HitTmp HVar6;
  float p;
  float local_24;
  
  local_24 = (float)((ulong)in_RAX >> 0x20);
  if ((node == (treenode *)0x0) || (bVar1 = AABox::intersect(&node->bound,ray), !bVar1)) {
    pBVar4 = (BasicPrimitive *)0x0;
  }
  else {
    pBVar4 = node->shape;
    if (pBVar4 == (BasicPrimitive *)0x0) {
      HVar5 = treehit(this,ray,node->lc);
      if (HVar5.primitive == (BasicPrimitive *)0x0) {
        HVar5 = treehit(this,ray,node->rc);
      }
      else {
        in_XMM1_Da = HVar5.t;
        HVar6 = treehit(this,ray,node->rc);
        pBVar3 = HVar6.primitive;
        in_XMM1_Db = 0;
        pBVar4 = HVar5.primitive;
        if (HVar6.t <= in_XMM1_Da && pBVar3 != (BasicPrimitive *)0x0) {
          pBVar4 = pBVar3;
        }
        HVar5._8_8_ = HVar6._8_8_;
        HVar5.primitive = pBVar4;
        if (in_XMM1_Da < HVar6.t || pBVar3 == (BasicPrimitive *)0x0) goto LAB_00134cbc;
      }
      pBVar4 = HVar5.primitive;
      in_XMM1_Da = HVar5.t;
      in_XMM1_Db = HVar5._12_4_;
    }
    else {
      iVar2 = (*(pBVar4->super_Primitive)._vptr_Primitive[3])(pBVar4,ray,&local_24);
      if ((char)iVar2 == '\0') {
        pBVar4 = (BasicPrimitive *)0x0;
      }
      else {
        pBVar4 = node->shape;
      }
      in_XMM1_Db = 0;
      in_XMM1_Da = local_24;
    }
  }
LAB_00134cbc:
  HVar6._12_4_ = in_XMM1_Db;
  HVar6.t = in_XMM1_Da;
  HVar6.primitive = pBVar4;
  return HVar6;
}

Assistant:

HitTmp treehit(const Ray& ray, treenode* node) const {
		if (node == NULL) return HitTmp();
		if (!node->bound.intersect(ray)) return HitTmp();
		if (node->shape != NULL) {
			float p;
			bool t = node->shape->intersect(ray, p);
			return HitTmp(t? node->shape: NULL, p);
		}
		HitTmp resl = treehit(ray, node->lc);
		if (!resl) return treehit(ray, node->rc);
		HitTmp resr = treehit(ray, node->rc);
		return (!resr || resl.t < resr.t)? resl: resr;
	}